

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O0

void __thiscall
cali::Caliper::push_snapshot(Caliper *this,ChannelBody *chB,SnapshotView trigger_info)

{
  SnapshotView view;
  SnapshotBuilder *this_00;
  callback<void(cali::Caliper*,cali::SnapshotView,cali::SnapshotView)> *this_01;
  SnapshotView local_88;
  Caliper *local_78;
  Caliper *local_70;
  Caliper *local_68;
  Entry *pEStack_60;
  SnapshotView local_58;
  SnapshotBuilder *local_48;
  SnapshotBuilder *rec;
  lock_guard<(anonymous_namespace)::siglock> local_30;
  lock_guard<(anonymous_namespace)::siglock> g;
  ChannelBody *chB_local;
  Caliper *this_local;
  SnapshotView trigger_info_local;
  
  trigger_info_local.m_data = (Entry *)trigger_info.m_len;
  this_local = (Caliper *)trigger_info.m_data;
  g._M_device = (mutex_type *)chB;
  std::lock_guard<(anonymous_namespace)::siglock>::lock_guard(&local_30,&this->sT->lock);
  FixedSizeSnapshotRecord<120UL>::reset(&this->sT->snapshot);
  local_48 = FixedSizeSnapshotRecord<120UL>::builder(&this->sT->snapshot);
  Blackboard::snapshot(&this->sT->thread_blackboard,local_48);
  ThreadData::update_process_snapshot
            (this->sT,&this->sG->process_blackboard,&this->sG->process_blackboard_lock);
  this_00 = local_48;
  local_58 = FixedSizeSnapshotRecord<120UL>::view(&this->sT->process_snapshot);
  SnapshotBuilder::append(this_00,local_58);
  local_68 = this_local;
  pEStack_60 = trigger_info_local.m_data;
  view.m_len = (size_t)trigger_info_local.m_data;
  view.m_data = (Entry *)this_local;
  SnapshotBuilder::append(local_48,view);
  local_70 = this;
  util::callback<void(cali::Caliper*,cali::SnapshotView,cali::SnapshotBuilder&)>::operator()
            ((callback<void(cali::Caliper*,cali::SnapshotView,cali::SnapshotBuilder&)> *)
             (g._M_device + 0x52),&local_70,(SnapshotView *)&this_local,local_48);
  this_01 = (callback<void(cali::Caliper*,cali::SnapshotView,cali::SnapshotView)> *)
            (g._M_device + 0x58);
  local_78 = this;
  local_88 = SnapshotBuilder::view(local_48);
  util::callback<void(cali::Caliper*,cali::SnapshotView,cali::SnapshotView)>::operator()
            (this_01,&local_78,(SnapshotView *)&this_local,&local_88);
  std::lock_guard<(anonymous_namespace)::siglock>::~lock_guard(&local_30);
  return;
}

Assistant:

void Caliper::push_snapshot(ChannelBody* chB, SnapshotView trigger_info)
{
    std::lock_guard<::siglock> g(sT->lock);

    sT->snapshot.reset();
    SnapshotBuilder& rec = sT->snapshot.builder();

    sT->thread_blackboard.snapshot(rec);
    sT->update_process_snapshot(sG->process_blackboard, sG->process_blackboard_lock);
    rec.append(sT->process_snapshot.view());

    rec.append(trigger_info);

    chB->events.snapshot(this, trigger_info, rec);
    chB->events.process_snapshot(this, trigger_info, rec.view());
}